

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

pair<int,_int>
jsoncons::decode_traits<std::pair<int,int>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  int iVar3;
  int iVar4;
  basic_staj_event<char> *pbVar5;
  error_code *in_RDX;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RSI;
  error_code *in_RDI;
  int v2;
  int v1;
  conv_errc __e;
  pair<int,_int> local_8;
  
  (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,in_RDX);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    std::pair<int,_int>::pair<int,_int,_true>(&local_8);
  }
  else {
    pbVar5 = (basic_staj_event<char> *)(**(code **)(*(long *)in_RDI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar5);
    if (sVar2 == begin_array) {
      (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,in_RDX);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar1) {
        std::pair<int,_int>::pair<int,_int,_true>(&local_8);
      }
      else {
        iVar3 = decode_traits<int,char,void>::
                decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                          ((basic_staj_cursor<char> *)in_RDI,in_RSI,in_RDX);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          std::pair<int,_int>::pair<int,_int,_true>(&local_8);
        }
        else {
          (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,in_RDX);
          bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
          if (bVar1) {
            std::pair<int,_int>::pair<int,_int,_true>(&local_8);
          }
          else {
            iVar4 = decode_traits<int,char,void>::
                    decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                              ((basic_staj_cursor<char> *)in_RDI,in_RSI,in_RDX);
            __e = (conv_errc)((ulong)in_RSI >> 0x20);
            bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
            if (bVar1) {
              std::pair<int,_int>::pair<int,_int,_true>(&local_8);
            }
            else {
              (**(code **)(*(long *)in_RDI + 0x40))(in_RDI,in_RDX);
              pbVar5 = (basic_staj_event<char> *)(**(code **)(*(long *)in_RDI + 0x20))();
              sVar2 = basic_staj_event<char>::event_type(pbVar5);
              if (sVar2 == end_array) {
                local_8 = std::make_pair<int&,int&>((int *)CONCAT44(iVar3,iVar4),(int *)0x28ef62);
              }
              else {
                std::error_code::operator=(in_RDI,__e);
                std::pair<int,_int>::pair<int,_int,_true>(&local_8);
              }
            }
          }
        }
      }
    }
    else {
      std::error_code::operator=(in_RDI,(conv_errc)((ulong)in_RSI >> 0x20));
      std::pair<int,_int>::pair<int,_int,_true>(&local_8);
    }
  }
  return local_8;
}

Assistant:

static std::pair<T1, T2> decode(basic_staj_cursor<CharT>& cursor,
            json_decoder<Json, TempAllocator>& decoder,
            std::error_code& ec)
        {
            using value_type = std::pair<T1, T2>;
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            cursor.next(ec); // skip past array
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type();
            }

            T1 v1 = decode_traits<T1,CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            T2 v2 = decode_traits<T2, CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);

            if (cursor.current().event_type() != staj_event_type::end_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            return std::make_pair(v1, v2);
        }